

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall
DirectiveObjImport::DirectiveObjImport
          (DirectiveObjImport *this,path *inputName,Identifier *ctorName)

{
  ElfRelocator *this_00;
  CAssemblerCommand *pCVar1;
  CAssemblerCommand *pCVar2;
  int iVar3;
  CAssemblerCommand *local_30;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__DirectiveObjImport_001b91a8;
  this_00 = &this->rel;
  ElfRelocator::ElfRelocator(this_00);
  (this->ctor)._M_t.
  super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
  super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
  super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl = (CAssemblerCommand *)0x0;
  iVar3 = ElfRelocator::init(this_00,(EVP_PKEY_CTX *)inputName);
  (this->super_CAssemblerCommand).field_0x14 = (char)iVar3;
  if ((char)iVar3 != '\0') {
    ElfRelocator::exportSymbols(this_00);
    ElfRelocator::generateCtor((ElfRelocator *)&stack0xffffffffffffffd0,(Identifier *)this_00);
    pCVar2 = local_30;
    local_30 = (CAssemblerCommand *)0x0;
    pCVar1 = (this->ctor)._M_t.
             super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
             super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
             super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
    (this->ctor)._M_t.
    super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
    super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
    super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl = pCVar2;
    if (pCVar1 != (CAssemblerCommand *)0x0) {
      (*pCVar1->_vptr_CAssemblerCommand[1])();
      if (local_30 != (CAssemblerCommand *)0x0) {
        (**(code **)(*(long *)local_30 + 8))();
      }
    }
  }
  return;
}

Assistant:

DirectiveObjImport::DirectiveObjImport(const fs::path& inputName, const Identifier& ctorName)
{
	success = rel.init(inputName);
	if (success)
	{
		rel.exportSymbols();
		ctor = rel.generateCtor(ctorName);
	}
}